

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::simplify
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  op_interface<viennamath::rt_expression_interface<double>_> *poVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  undefined4 extraout_var_01;
  _func_int **extraout_XMM0_Qa;
  _func_int *extraout_XMM0_Qa_00;
  undefined4 extraout_var_00;
  
  iVar2 = (*((this->expr_)._M_ptr)->_vptr_rt_expression_interface[8])();
  if ((char)iVar2 == '\0') {
    prVar3 = (rt_expression_interface<double> *)operator_new(0x18);
    iVar2 = (*((this->expr_)._M_ptr)->_vptr_rt_expression_interface[0x10])();
    pp_Var5 = (_func_int **)CONCAT44(extraout_var,iVar2);
    iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
    pp_Var4 = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[10])();
    if ((char)iVar2 != '\0') {
      prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
      poVar1 = (this->op_)._M_ptr;
      (*((this->expr_)._M_ptr)->_vptr_rt_expression_interface[9])();
      (*poVar1->_vptr_op_interface[4])(poVar1);
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00118538;
      prVar3[1]._vptr_rt_expression_interface = extraout_XMM0_Qa;
      return prVar3;
    }
    prVar3 = (rt_expression_interface<double> *)operator_new(0x18);
    pp_Var5 = (_func_int **)operator_new(0x10);
    (*((this->expr_)._M_ptr)->_vptr_rt_expression_interface[9])();
    *pp_Var5 = (_func_int *)&PTR__rt_expression_interface_00118538;
    pp_Var5[1] = extraout_XMM0_Qa_00;
    iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
    pp_Var4 = (_func_int **)CONCAT44(extraout_var_01,iVar2);
  }
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_00118b88;
  prVar3[1]._vptr_rt_expression_interface = pp_Var5;
  prVar3[2]._vptr_rt_expression_interface = pp_Var4;
  return prVar3;
}

Assistant:

InterfaceType * simplify() const
      {
        if (expr_->is_constant())
        {
          if (op_->can_simplify())
            return new rt_constant<numeric_type, InterfaceType>( op_->apply(expr_->unwrap()) );
          else
            return new rt_unary_expr(new rt_constant<numeric_type, InterfaceType>(expr_->unwrap()),
                                     op_->clone());
        }

        //TODO: Unwrap op_id()

        return new rt_unary_expr(expr_->simplify(), op_->clone());
      }